

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O2

void __thiscall TrodesMsg::TrodesMsg(TrodesMsg *this)

{
  zmsg_t *pzVar1;
  
  (this->format)._M_dataplus._M_p = (pointer)&(this->format).field_2;
  (this->format)._M_string_length = 0;
  (this->format).field_2._M_local_buf[0] = '\0';
  pzVar1 = zmsg_new();
  this->msg = pzVar1;
  return;
}

Assistant:

TrodesMsg::TrodesMsg()
{
    msg = zmsg_new();
}